

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTriangleShapeEx.cpp
# Opt level: O2

int __thiscall
cbtPrimitiveTriangle::clip_triangle
          (cbtPrimitiveTriangle *this,cbtPrimitiveTriangle *other,cbtVector3 *clipped_points)

{
  int iVar1;
  int iVar2;
  cbtVector4 edgeplane;
  cbtVector3 temp_points1 [16];
  cbtVector3 temp_points [16];
  
  iVar2 = 0;
  get_edge_plane(this,0,&edgeplane);
  iVar1 = bt_plane_clip_triangle
                    (&edgeplane,other->m_vertices,other->m_vertices + 1,other->m_vertices + 2,
                     temp_points);
  if (iVar1 != 0) {
    get_edge_plane(this,1,&edgeplane);
    iVar1 = bt_plane_clip_polygon(&edgeplane,temp_points,iVar1,temp_points1);
    if (iVar1 == 0) {
      iVar2 = 0;
    }
    else {
      get_edge_plane(this,2,&edgeplane);
      iVar2 = bt_plane_clip_polygon(&edgeplane,temp_points1,iVar1,clipped_points);
    }
  }
  return iVar2;
}

Assistant:

int cbtPrimitiveTriangle::clip_triangle(cbtPrimitiveTriangle& other, cbtVector3* clipped_points)
{
	// edge 0

	cbtVector3 temp_points[MAX_TRI_CLIPPING];

	cbtVector4 edgeplane;

	get_edge_plane(0, edgeplane);

	int clipped_count = bt_plane_clip_triangle(
		edgeplane, other.m_vertices[0], other.m_vertices[1], other.m_vertices[2], temp_points);

	if (clipped_count == 0) return 0;

	cbtVector3 temp_points1[MAX_TRI_CLIPPING];

	// edge 1
	get_edge_plane(1, edgeplane);

	clipped_count = bt_plane_clip_polygon(edgeplane, temp_points, clipped_count, temp_points1);

	if (clipped_count == 0) return 0;

	// edge 2
	get_edge_plane(2, edgeplane);

	clipped_count = bt_plane_clip_polygon(
		edgeplane, temp_points1, clipped_count, clipped_points);

	return clipped_count;
}